

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O3

void __thiscall Timidity::Instrument::~Instrument(Instrument *this)

{
  BYTE *pBVar1;
  Sample *__ptr;
  int iVar2;
  
  iVar2 = this->samples;
  __ptr = this->sample;
  if (iVar2 != 0) {
    pBVar1 = &__ptr->type;
    do {
      if ((*pBVar1 == '\0') && (*(sample_t **)(pBVar1 + -0x1c) != (sample_t *)0x0)) {
        free(*(sample_t **)(pBVar1 + -0x1c));
      }
      pBVar1 = pBVar1 + 0x68;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    __ptr = this->sample;
  }
  free(__ptr);
  return;
}

Assistant:

Instrument::~Instrument()
{
	Sample *sp;
	int i;

	for (i = samples, sp = &(sample[0]); i != 0; i--, sp++)
	{
		if (sp->type == INST_GUS && sp->data != NULL)
		{
			free(sp->data);
		}
	}
	free(sample);
}